

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::prepare_insert(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *this,size_t hash)

{
  size_t i;
  T TVar1;
  ctrl_t *pcVar2;
  FindInfo FVar3;
  
  FVar3 = find_first_non_full(this,hash);
  i = FVar3.offset;
  pcVar2 = this->ctrl_;
  TVar1 = (this->settings_).
          super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
          .
          super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_0UL,_false>
          .value;
  if (TVar1 == 0) {
    if (pcVar2[i] == -2) {
      TVar1 = 0;
    }
    else {
      rehash_and_grow_if_necessary(this);
      FVar3 = find_first_non_full(this,hash);
      i = FVar3.offset;
      pcVar2 = this->ctrl_;
      TVar1 = (this->settings_).
              super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_0UL,_false>
              .value;
    }
  }
  this->size_ = this->size_ + 1;
  (this->settings_).
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_0UL,_false>
  .value = TVar1 - (pcVar2[i] == -0x80);
  set_ctrl(this,i,(byte)hash & 0x7f);
  return i;
}

Assistant:

size_t prepare_insert(size_t hash) PHMAP_ATTRIBUTE_NOINLINE {
        auto target = find_first_non_full(hash);
        if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
                               !IsDeleted(ctrl_[target.offset]))) {
            rehash_and_grow_if_necessary();
            target = find_first_non_full(hash);
        }
        ++size_;
        growth_left() -= IsEmpty(ctrl_[target.offset]);
        set_ctrl(target.offset, H2(hash));
        infoz_.RecordInsert(hash, target.probe_length);
        return target.offset;
    }